

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<long_long,signed_char>(void)

{
  int64_t a;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int64_t tmp;
  int64_t u1;
  int64_t tmp_1;
  char local_49;
  int64_t local_48;
  int64_t local_40;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  
  local_48 = 0;
  LargeIntRegMultiply<long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,0,&local_48);
  local_48 = 0;
  local_40 = 0;
  local_38.m_int = 0;
  LargeIntRegMultiply<long,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_48,&local_40,&local_38.m_int);
  local_48 = 0;
  LargeIntRegMultiply<long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,0,&local_48);
  local_48 = 0;
  LargeIntRegMultiply<long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,0,&local_48);
  a = local_48;
  local_48 = 0;
  LargeIntRegMultiply<long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(a,0,&local_48);
  local_38.m_int = 1;
  local_40 = CONCAT71(local_40._1_7_,1);
  local_48 = 0;
  DivisionHelper<long_long,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_40,&local_48);
  local_48 = 0;
  local_40 = 1;
  DivisionHelper<long_long,_long_long,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,&local_40,&local_48);
  operator/('\x01',local_38);
  local_48._0_1_ = 1;
  DivisionHelper<long_long,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_48,(longlong *)&local_38);
  local_48 = CONCAT71(local_48._1_7_,1);
  DivisionHelper<long_long,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_48,(longlong *)&local_38);
  local_40 = CONCAT71(local_40._1_7_,1);
  local_48 = 0;
  AdditionHelper<long_long,_signed_char,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_40,&local_48);
  local_48 = 0;
  local_40 = 1;
  AdditionHelper<long_long,_long_long,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,&local_40,&local_48);
  local_49 = '\x01';
  local_48 = 0;
  local_40 = local_38.m_int;
  AdditionHelper<long_long,_signed_char,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_40,&local_49,&local_48)
  ;
  local_48._0_1_ = 1;
  AdditionHelper<long_long,_signed_char,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_48,(longlong *)&local_38);
  local_48 = CONCAT71(local_48._1_7_,1);
  AdditionHelper<long_long,_signed_char,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((longlong *)&local_38,(char *)&local_48,(longlong *)&local_38);
  local_38.m_int = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             '\0');
  local_48 = local_38.m_int;
  local_49 = '\0';
  local_40 = 0;
  SubtractionHelper<signed_char,_long_long,_18>::
  SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_49,&local_48,&local_40)
  ;
  local_38.m_int = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             '\x01');
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_38,
                     (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
                    );
  operator<<(SVar1.m_int,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             '\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             '\x01');
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &local_38,
                     (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
                    );
  operator>>(SVar1.m_int,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             '\x01');
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}